

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O3

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>const>>
          (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *this,
          DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
          *other)

{
  double *pdVar1;
  double dVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  undefined8 *puVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  lVar3 = *(long *)(other + 0x20);
  lVar8 = *(long *)(other + 0x28);
  if ((lVar8 != 0 && lVar3 != 0) &&
     (auVar4 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar4 / SEXT816(lVar8),0) < lVar3)) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(8,lVar8,SUB168(auVar4 % SEXT816(lVar8),0));
    *puVar7 = operator_new;
    __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  if (lVar8 != 1 && lVar3 != 1) {
    __assert_fail("other.rows() == 1 || other.cols() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x16e,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resizeLike(const EigenBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>>]"
                 );
  }
  lVar8 = lVar8 * lVar3;
  if (-1 < lVar8) {
    DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)this,lVar8,lVar8,1);
    dVar11 = *(double *)(other + 0x18);
    dVar2 = *(double *)(other + 0x30);
    lVar3 = *(long *)(other + 0x20);
    if (*(long *)(this + 8) == lVar3) {
      if (*(long *)(other + 0x28) == 1) {
LAB_00110633:
        lVar8 = *(long *)this;
        uVar6 = lVar3 - (lVar3 >> 0x3f) & 0xfffffffffffffffe;
        dVar11 = dVar11 * dVar2;
        if (1 < lVar3) {
          lVar9 = 0;
          do {
            pdVar1 = (double *)(lVar8 + lVar9 * 8);
            *pdVar1 = dVar11;
            pdVar1[1] = dVar11;
            lVar9 = lVar9 + 2;
          } while (lVar9 < (long)uVar6);
        }
        auVar5 = _DAT_0012b620;
        auVar4 = _DAT_0012b610;
        lVar9 = lVar3 % 2;
        if (lVar9 != 0 && (long)uVar6 <= lVar3) {
          lVar10 = lVar9 + -1;
          auVar12._8_4_ = (int)lVar10;
          auVar12._0_8_ = lVar10;
          auVar12._12_4_ = (int)((ulong)lVar10 >> 0x20);
          lVar8 = lVar8 + (lVar3 / 2) * 0x10;
          uVar6 = 0;
          auVar12 = auVar12 ^ _DAT_0012b620;
          do {
            auVar13._8_4_ = (int)uVar6;
            auVar13._0_8_ = uVar6;
            auVar13._12_4_ = (int)(uVar6 >> 0x20);
            auVar13 = (auVar13 | auVar4) ^ auVar5;
            if ((bool)(~(auVar13._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar13._0_4_ ||
                        auVar12._4_4_ < auVar13._4_4_) & 1)) {
              *(double *)(lVar8 + uVar6 * 8) = dVar11;
            }
            if ((auVar13._12_4_ != auVar12._12_4_ || auVar13._8_4_ <= auVar12._8_4_) &&
                auVar13._12_4_ <= auVar12._12_4_) {
              *(double *)(lVar8 + 8 + uVar6 * 8) = dVar11;
            }
            uVar6 = uVar6 + 2;
          } while ((lVar9 + 1U & 0xfffffffffffffffe) != uVar6);
        }
        return;
      }
    }
    else if ((-1 < lVar3) && (*(long *)(other + 0x28) == 1)) {
      DenseStorage<double,_-1,_-1,_1,_0>::resize
                ((DenseStorage<double,__1,__1,_1,_0> *)this,lVar3,lVar3,1);
      if (*(long *)(this + 8) != lVar3) {
        __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/AssignEvaluator.h"
                      ,0x2fd,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>>, T1 = double, T2 = double]"
                     );
      }
      goto LAB_00110633;
    }
  }
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                ,0x115,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE PlainObjectBase(const DenseBase<OtherDerived> &other)
      : m_storage()
    {
      _check_template_params();
      resizeLike(other);
      _set_noalias(other);
    }